

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::DefaultReadCordTest_ReadCordEof_Test::
~DefaultReadCordTest_ReadCordEof_Test(DefaultReadCordTest_ReadCordEof_Test *this)

{
  DefaultReadCordTest_ReadCordEof_Test *this_local;
  
  ~DefaultReadCordTest_ReadCordEof_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(DefaultReadCordTest, ReadCordEof) {
  std::string source = "abcdefghijk";

  absl::Cord dest;
  ArrayInputStream input(source.data(), source.size());
  input.Skip(1);
  EXPECT_FALSE(input.ReadCord(&dest, source.size()));

  absl::Cord expected(source);
  expected.RemovePrefix(1);
  EXPECT_EQ(expected, dest);
}